

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinEsop.c
# Opt level: O1

void Min_EsopMinimize(Min_Man_t *p)

{
  undefined1 *puVar1;
  Min_Cube_t **ppMVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  Min_Cube_t *pMVar11;
  Min_Cube_t *pMVar12;
  Min_Cube_t *pMVar13;
  int iVar14;
  Min_Cube_t *pMVar15;
  int Var0;
  int local_54;
  int local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (2 < p->nCubes) {
    do {
      local_4c = p->nCubes;
      pMVar12 = p->pBubble;
      ppMVar2 = p->ppStore;
      pMVar12->pNext = *ppMVar2;
      *ppMVar2 = pMVar12;
      puVar1 = &p->pBubble->field_0x8;
      *(uint *)puVar1 = *(uint *)puVar1 & 0x3fffff;
LAB_00450602:
      pMVar12 = p->pBubble;
      uVar3 = *(uint *)&pMVar12->field_0x8 >> 0x16;
      uVar5 = (ulong)uVar3;
      pMVar13 = (Min_Cube_t *)((ulong)(uVar3 * 8) + (long)p->ppStore);
      do {
        pMVar11 = pMVar13;
        pMVar13 = pMVar11->pNext;
        if (pMVar13 == (Min_Cube_t *)0x0) break;
      } while (pMVar13 != pMVar12);
      if (pMVar13 != pMVar12) {
        __assert_fail("pCube == p->pBubble",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMinEsop.c"
                      ,0x65,"void Min_EsopRewrite(Min_Man_t *)");
      }
      pMVar11->pNext = pMVar12->pNext;
      pMVar12 = p->pBubble->pNext;
      if (pMVar12 == (Min_Cube_t *)0x0) {
        uVar8 = uVar3;
        if ((int)uVar3 < p->nVars) {
          uVar8 = p->nVars;
        }
        iVar10 = uVar8 + 1;
        lVar9 = -(ulong)(uVar3 * 8);
        do {
          if (uVar8 == uVar5) {
            pMVar12 = (Min_Cube_t *)0x0;
            goto LAB_0045067f;
          }
          pMVar12 = p->ppStore[uVar5 + 1];
          uVar5 = uVar5 + 1;
          lVar9 = lVar9 + -8;
        } while (pMVar12 == (Min_Cube_t *)0x0);
        pMVar11 = (Min_Cube_t *)((long)p->ppStore - lVar9);
      }
      iVar10 = (int)uVar5;
LAB_0045067f:
      pMVar13 = pMVar12;
      if (pMVar12 != (Min_Cube_t *)0x0) {
        do {
          pMVar15 = pMVar13;
          pMVar13 = pMVar15->pNext;
          if (pMVar13 == (Min_Cube_t *)0x0) {
            if (p->nVars <= iVar10) goto LAB_004506ec;
            pMVar13 = (Min_Cube_t *)(p->ppStore + (long)iVar10 + 1);
            goto LAB_004506c5;
          }
          iVar4 = Min_CubesDistTwo(pMVar12,pMVar13,&local_50,&local_54);
        } while (iVar4 == 0);
        goto LAB_004506ef;
      }
    } while (3.0 < ((double)(local_4c - p->nCubes) * 100.0) / (double)local_4c);
  }
  return;
  while (iVar4 = Min_CubesDistTwo(pMVar12,pMVar13,&local_50,&local_54), iVar4 == 0) {
LAB_004506c5:
    pMVar15 = pMVar13;
    pMVar13 = pMVar15->pNext;
    if (pMVar13 == (Min_Cube_t *)0x0) goto LAB_004506ec;
  }
LAB_004506ef:
  if (pMVar13 == (Min_Cube_t *)0x0) {
    if (iVar10 < p->nVars + -1) {
      pMVar13 = (Min_Cube_t *)(p->ppStore + (long)iVar10 + 2);
      do {
        pMVar15 = pMVar13;
        pMVar13 = pMVar15->pNext;
        if (pMVar13 == (Min_Cube_t *)0x0) goto LAB_00450732;
        iVar10 = Min_CubesDistTwo(pMVar12,pMVar13,&local_50,&local_54);
      } while (iVar10 == 0);
    }
    else {
LAB_00450732:
      pMVar13 = (Min_Cube_t *)0x0;
    }
  }
  if (pMVar13 == (Min_Cube_t *)0x0) {
    pMVar13 = p->pBubble;
    pMVar13->pNext = pMVar12->pNext;
    pMVar12->pNext = pMVar13;
    *(uint *)&pMVar13->field_0x8 =
         *(uint *)&pMVar13->field_0x8 & 0x3fffff | *(uint *)&pMVar12->field_0x8 & 0xffc00000;
  }
  else {
    pMVar15->pNext = pMVar13->pNext;
    pMVar11->pNext = p->pBubble;
    pMVar11 = p->pBubble;
    pMVar11->pNext = pMVar12->pNext;
    *(uint *)&pMVar11->field_0x8 =
         *(uint *)&pMVar11->field_0x8 & 0x3fffff | *(uint *)&pMVar12->field_0x8 & 0xffc00000;
    p->nCubes = p->nCubes + -2;
    bVar6 = (char)local_50 * '\x02';
    iVar10 = local_50 >> 4;
    bVar7 = (char)local_54 * '\x02';
    iVar4 = local_54 >> 4;
    local_38 = pMVar12->uData[iVar10] >> (bVar6 & 0x1f) & 3;
    local_34 = pMVar12->uData[iVar4] >> (bVar7 & 0x1f) & 3;
    local_3c = pMVar13->uData[iVar10] >> (bVar6 & 0x1f) & 3;
    uVar3 = pMVar13->uData[iVar4] >> (bVar7 & 0x1f) & 3;
    pMVar12->uData[iVar10] = local_3c << (bVar6 & 0x1f) ^ pMVar12->uData[iVar10];
    local_48 = local_3c ^ local_38;
    local_40 = (uint)(local_48 != 3) * 0x400000;
    *(uint *)&pMVar12->field_0x8 =
         *(uint *)&pMVar12->field_0x8 & 0x3fffff |
         ((uint)(local_38 == 3) * 0x400000 + *(uint *)&pMVar12->field_0x8 + local_40) - 0x400000 &
         0xffc00000;
    pMVar13->uData[iVar4] = pMVar13->uData[iVar4] ^ local_34 << (bVar7 & 0x1f);
    local_44 = (uint)((uVar3 ^ local_34) != 3);
    iVar14 = local_44 * 0x400000;
    *(uint *)&pMVar13->field_0x8 =
         (uint)(uVar3 == 3) * 0x400000 + iVar14 + *(int *)&pMVar13->field_0x8 + -0x400000;
    iVar10 = p->nCubes;
    Min_EsopAddCube(p,pMVar12);
    Min_EsopAddCube(p,pMVar13);
    iVar4 = p->nCubes;
    if (iVar10 + 2 <= iVar4) {
      uVar8 = *(uint *)&pMVar13->field_0x8 >> 0x16;
      if (pMVar13 != p->ppStore[uVar8]) {
        __assert_fail("pThis == p->ppStore[pThis->nLits]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMinEsop.c"
                      ,0xb3,"void Min_EsopRewrite(Min_Man_t *)");
      }
      p->ppStore[uVar8] = pMVar13->pNext;
      uVar8 = *(uint *)&pMVar12->field_0x8 >> 0x16;
      if (pMVar12 != p->ppStore[uVar8]) {
        __assert_fail("pCube == p->ppStore[pCube->nLits]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMinEsop.c"
                      ,0xb5,"void Min_EsopRewrite(Min_Man_t *)");
      }
      p->ppStore[uVar8] = pMVar12->pNext;
      p->nCubes = iVar4 + -2;
      bVar6 = (char)local_50 * '\x02';
      pMVar12->uData[local_50 >> 4] = pMVar12->uData[local_50 >> 4] ^ local_3c << (bVar6 & 0x1f);
      *(uint *)&pMVar12->field_0x8 =
           *(int *)&pMVar12->field_0x8 +
           (uint)(local_38 != 3) * 0x400000 + (uint)(local_48 == 3) * 0x400000 + -0x400000;
      pMVar12->uData[local_54 >> 4] =
           pMVar12->uData[local_54 >> 4] ^ uVar3 << ((char)local_54 * '\x02' & 0x1fU);
      *(uint *)&pMVar12->field_0x8 =
           *(int *)&pMVar12->field_0x8 + iVar14 + (uint)(local_34 != 3) * -0x400000;
      pMVar13->uData[local_50 >> 4] = pMVar13->uData[local_50 >> 4] ^ local_38 << (bVar6 & 0x1f);
      *(uint *)&pMVar13->field_0x8 =
           *(int *)&pMVar13->field_0x8 + local_40 + (uint)(local_3c != 3) * -0x400000;
      pMVar13->uData[local_54 >> 4] =
           pMVar13->uData[local_54 >> 4] ^ local_34 << ((char)local_54 * '\x02' & 0x1fU);
      *(uint *)&pMVar13->field_0x8 =
           *(int *)&pMVar13->field_0x8 + (uint)(uVar3 != 3) * 0x400000 + local_44 * -0x400000;
      Min_EsopAddCube(p,pMVar12);
      Min_EsopAddCube(p,pMVar13);
    }
  }
  goto LAB_00450602;
LAB_004506ec:
  pMVar13 = (Min_Cube_t *)0x0;
  goto LAB_004506ef;
}

Assistant:

void Min_EsopMinimize( Min_Man_t * p )
{
    int nCubesInit, nCubesOld, nIter;
    if ( p->nCubes < 3 )
        return;
    nIter = 0;
    nCubesInit = p->nCubes;
    do {
        nCubesOld = p->nCubes;
        Min_EsopRewrite( p );
        nIter++;
    }
    while ( 100.0*(nCubesOld - p->nCubes)/nCubesOld > 3.0 );

//    printf( "%d:%d->%d ", nIter, nCubesInit, p->nCubes );
}